

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

Convolution3DLayerParams * __thiscall
CoreML::Specification::Convolution3DLayerParams::New(Convolution3DLayerParams *this,Arena *arena)

{
  Convolution3DLayerParams *this_00;
  Convolution3DLayerParams *n;
  Arena *arena_local;
  Convolution3DLayerParams *this_local;
  
  this_00 = (Convolution3DLayerParams *)operator_new(0x90);
  Convolution3DLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::Convolution3DLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

Convolution3DLayerParams* Convolution3DLayerParams::New(::google::protobuf::Arena* arena) const {
  Convolution3DLayerParams* n = new Convolution3DLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}